

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O3

bool __thiscall SSD1306::OledI2C::isSetPixel(OledI2C *this,OledPoint p)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  
  bVar3 = OledPixel::pixelInside(&this->super_OledPixel,p);
  if (bVar3) {
    uVar1 = p.m_y;
    uVar4 = uVar1 + 7;
    if (-1 < (long)p) {
      uVar4 = uVar1;
    }
    uVar2 = p.m_x;
    uVar5 = uVar2 + 0x1f;
    if (-1 < (int)uVar2) {
      uVar5 = uVar2;
    }
    bVar3 = ((this->blocks_)._M_elems[((int)uVar5 >> 5) + ((int)uVar4 >> 3) * 4].bytes_._M_elems
             [(long)(int)(uVar2 - (uVar5 & 0xffffffe0)) + 1] >> (uVar1 & 7) & 1) != 0;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool
SSD1306::OledI2C::isSetPixel(
    SSD1306::OledPoint p) const
{
    if (not pixelInside(p))
    {
        return false;
    }

    PixelOffset po{p};

    return blocks_[po.block].bytes_[po.byte] & (1 << po.bit);
}